

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureSpecCase::TextureSpecCase
          (TextureSpecCase *this,Context *context,char *name,char *desc,TextureType type,
          TextureFormat format,deUint32 flags,int width,int height)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021696a8;
  (this->super_TestCase).m_context = context;
  sglr::ContextWrapper::ContextWrapper(&this->super_ContextWrapper);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureSpecCase_02172830;
  this->m_texType = type;
  this->m_texFormat = format;
  this->m_flags = flags;
  this->m_width = width;
  this->m_height = height;
  Tex2DShader::Tex2DShader(&this->m_tex2DShader);
  TexCubeShader::TexCubeShader(&this->m_texCubeNegXShader,CUBEFACE_NEGATIVE_X);
  TexCubeShader::TexCubeShader(&this->m_texCubePosXShader,CUBEFACE_POSITIVE_X);
  TexCubeShader::TexCubeShader(&this->m_texCubeNegYShader,CUBEFACE_NEGATIVE_Y);
  TexCubeShader::TexCubeShader(&this->m_texCubePosYShader,CUBEFACE_POSITIVE_Y);
  TexCubeShader::TexCubeShader(&this->m_texCubeNegZShader,CUBEFACE_NEGATIVE_Z);
  TexCubeShader::TexCubeShader(&this->m_texCubePosZShader,CUBEFACE_POSITIVE_Z);
  return;
}

Assistant:

TextureSpecCase::TextureSpecCase (Context& context, const char* name, const char* desc, const TextureType type, const tcu::TextureFormat format, const deUint32 flags, int width, int height)
	: TestCase				(context, name, desc)
	, m_texType				(type)
	, m_texFormat			(format)
	, m_flags				(flags)
	, m_width				(width)
	, m_height				(height)
	, m_texCubeNegXShader	(tcu::CUBEFACE_NEGATIVE_X)
	, m_texCubePosXShader	(tcu::CUBEFACE_POSITIVE_X)
	, m_texCubeNegYShader	(tcu::CUBEFACE_NEGATIVE_Y)
	, m_texCubePosYShader	(tcu::CUBEFACE_POSITIVE_Y)
	, m_texCubeNegZShader	(tcu::CUBEFACE_NEGATIVE_Z)
	, m_texCubePosZShader	(tcu::CUBEFACE_POSITIVE_Z)
{
}